

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void test_rsa_sign(void)

{
  ptls_sign_certificate_t *ppVar1;
  EVP_PKEY *key;
  _func_int_st_ptls_sign_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr_ptls_buffer_t_ptr_ptls_iovec_t_uint16_t_ptr_size_t
  *verify_ctx;
  int iVar2;
  size_t sVar3;
  EVP_MD *md;
  ptls_iovec_t pVar4;
  ptls_iovec_t signature;
  undefined1 local_438 [8];
  uint8_t sigbuf_small [1024];
  ptls_buffer_t sigbuf;
  void *message;
  ptls_openssl_sign_certificate_t *sc;
  
  ppVar1 = ctx->sign_certificate;
  ptls_buffer_init((ptls_buffer_t *)(sigbuf_small + 0x3f8),local_438,0x400);
  key = (EVP_PKEY *)ppVar1[1].cb;
  sVar3 = strlen("hello world");
  pVar4 = ptls_iovec_init("hello world",sVar3);
  md = EVP_sha256();
  iVar2 = do_sign(key,(ptls_buffer_t *)(sigbuf_small + 0x3f8),pVar4,(EVP_MD *)md);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c",0x8d);
  EVP_PKEY_up_ref(ppVar1[1].cb);
  verify_ctx = ppVar1[1].cb;
  sVar3 = strlen("hello world");
  pVar4 = ptls_iovec_init("hello world",sVar3);
  signature = ptls_iovec_init((void *)sigbuf_small._1016_8_,sigbuf.capacity);
  iVar2 = verify_sign(verify_ctx,pVar4,signature);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/openssl.c",0x8f);
  ptls_buffer_dispose((ptls_buffer_t *)(sigbuf_small + 0x3f8));
  return;
}

Assistant:

static void test_rsa_sign(void)
{
    ptls_openssl_sign_certificate_t *sc = (ptls_openssl_sign_certificate_t *)ctx->sign_certificate;

    const void *message = "hello world";
    ptls_buffer_t sigbuf;
    uint8_t sigbuf_small[1024];

    ptls_buffer_init(&sigbuf, sigbuf_small, sizeof(sigbuf_small));
    ok(do_sign(sc->key, &sigbuf, ptls_iovec_init(message, strlen(message)), EVP_sha256()) == 0);
    EVP_PKEY_up_ref(sc->key);
    ok(verify_sign(sc->key, ptls_iovec_init(message, strlen(message)), ptls_iovec_init(sigbuf.base, sigbuf.off)) == 0);

    ptls_buffer_dispose(&sigbuf);
}